

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_dce.c
# Opt level: O3

void lj_opt_dce(jit_State *J)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  IRIns *pIVar6;
  uint uVar7;
  ulong uVar8;
  IRRef1 *pIVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  IRRef ref;
  undefined1 auVar14 [16];
  long alStack_330 [102];
  long lVar15;
  
  if ((J->flags & 0x40000) != 0) {
    uVar8 = (ulong)(J->cur).nsnap;
    if (uVar8 != 0) {
      uVar10 = 0;
      do {
        pSVar4 = (J->cur).snap;
        uVar12 = (ulong)pSVar4[uVar10].nent;
        if (uVar12 != 0) {
          uVar7 = pSVar4[uVar10].mapofs;
          pSVar5 = (J->cur).snapmap;
          uVar13 = 0;
          do {
            uVar3 = (ushort)pSVar5[uVar7 + uVar13];
            if (0x8000 < uVar3) {
              pbVar1 = (byte *)((long)(J->cur).ir + (ulong)uVar3 * 8 + 4);
              *pbVar1 = *pbVar1 | 0x20;
            }
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar8);
    }
    pIVar9 = J->chain + 1;
    lVar11 = 1;
    auVar14 = _DAT_00160540;
    do {
      if (SUB164(auVar14 ^ _DAT_00160550,4) == -0x80000000 &&
          SUB164(auVar14 ^ _DAT_00160550,0) < -0x7fffff9b) {
        alStack_330[lVar11] = (long)(pIVar9 + -1);
        alStack_330[lVar11 + 1] = (long)pIVar9;
      }
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar15 + 2;
      lVar11 = lVar11 + 2;
      pIVar9 = pIVar9 + 2;
    } while (lVar11 != 0x67);
    uVar7 = (J->cur).nins - 1;
    if (0x8000 < uVar7) {
      lVar11 = (ulong)uVar7 * 8 + 6;
      do {
        pIVar6 = (J->cur).ir;
        bVar2 = *(byte *)((long)pIVar6 + lVar11 + -2);
        if ((bVar2 & 0x20) == 0) {
          uVar8 = (ulong)*(byte *)((long)pIVar6 + lVar11 + -1);
          if (0x5f < ((bVar2 | 0x60) & lj_ir_mode[uVar8])) goto LAB_0014c563;
          *(undefined2 *)alStack_330[uVar8 + 1] = *(undefined2 *)((long)pIVar6 + lVar11);
          *(undefined8 *)((long)pIVar6 + lVar11 + -6) = 0xc0000000000;
        }
        else {
          *(byte *)((long)pIVar6 + lVar11 + -2) = bVar2 & 0xdf;
          uVar8 = (ulong)*(byte *)((long)pIVar6 + lVar11 + -1);
LAB_0014c563:
          alStack_330[uVar8 + 1] = (long)pIVar6 + lVar11;
          uVar8 = (ulong)*(ushort *)((long)pIVar6 + lVar11 + -6);
          if (0x8000 < uVar8) {
            pbVar1 = (byte *)((long)(J->cur).ir + uVar8 * 8 + 4);
            *pbVar1 = *pbVar1 | 0x20;
          }
          uVar8 = (ulong)*(ushort *)((long)pIVar6 + lVar11 + -4);
          if (0x8000 < uVar8) {
            pbVar1 = (byte *)((long)(J->cur).ir + uVar8 * 8 + 4);
            *pbVar1 = *pbVar1 | 0x20;
          }
        }
        uVar7 = uVar7 - 1;
        lVar11 = lVar11 + -8;
      } while (0x8000 < uVar7);
    }
    J->bpropcache[0xe].key = 0;
    J->bpropcache[0xe].val = 0;
    J->bpropcache[0xe].mode = 0;
    J->bpropcache[0xf].key = 0;
    J->bpropcache[0xf].val = 0;
    J->bpropcache[0xf].mode = 0;
    J->bpropcache[0xc].key = 0;
    J->bpropcache[0xc].val = 0;
    J->bpropcache[0xc].mode = 0;
    J->bpropcache[0xd].key = 0;
    J->bpropcache[0xd].val = 0;
    J->bpropcache[0xd].mode = 0;
    J->bpropcache[10].key = 0;
    J->bpropcache[10].val = 0;
    J->bpropcache[10].mode = 0;
    J->bpropcache[0xb].key = 0;
    J->bpropcache[0xb].val = 0;
    J->bpropcache[0xb].mode = 0;
    J->bpropcache[8].key = 0;
    J->bpropcache[8].val = 0;
    J->bpropcache[8].mode = 0;
    J->bpropcache[9].key = 0;
    J->bpropcache[9].val = 0;
    J->bpropcache[9].mode = 0;
    J->bpropcache[6].key = 0;
    J->bpropcache[6].val = 0;
    J->bpropcache[6].mode = 0;
    J->bpropcache[7].key = 0;
    J->bpropcache[7].val = 0;
    J->bpropcache[7].mode = 0;
    J->bpropcache[4].key = 0;
    J->bpropcache[4].val = 0;
    J->bpropcache[4].mode = 0;
    J->bpropcache[5].key = 0;
    J->bpropcache[5].val = 0;
    J->bpropcache[5].mode = 0;
    J->bpropcache[2].key = 0;
    J->bpropcache[2].val = 0;
    J->bpropcache[2].mode = 0;
    J->bpropcache[3].key = 0;
    J->bpropcache[3].val = 0;
    J->bpropcache[3].mode = 0;
    J->bpropcache[0].key = 0;
    J->bpropcache[0].val = 0;
    J->bpropcache[0].mode = 0;
    J->bpropcache[1].key = 0;
    J->bpropcache[1].val = 0;
    J->bpropcache[1].mode = 0;
  }
  return;
}

Assistant:

void lj_opt_dce(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_DCE)) {
    dce_marksnap(J);
    dce_propagate(J);
    memset(J->bpropcache, 0, sizeof(J->bpropcache));  /* Invalidate cache. */
  }
}